

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O2

string * Vector::fullName(string *__return_storage_ptr__,string *element_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"/std/vector<",element_name);
  std::operator+(__return_storage_ptr__,&local_30,">");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string Vector::fullName(std::string const& element_name)
{ return "/std/vector<" + element_name + ">"; }